

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

uint __thiscall
chrono::fea::ChContactTriangleXYZ::GetSubBlockOffset(ChContactTriangleXYZ *this,int nblock)

{
  element_type *peVar1;
  uint uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  if (nblock == 2) {
    peVar1 = (this->mnode3).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode3).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  }
  else if (nblock == 1) {
    peVar1 = (this->mnode2).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode2).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  }
  else {
    if (nblock != 0) {
      return 0;
    }
    peVar1 = (this->mnode1).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->mnode1).
              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uVar2 = *(uint *)((long)&(peVar1->super_ChNodeFEAbase).m_TotalMass +
                     (long)((peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    uVar2 = *(uint *)((long)&(peVar1->super_ChNodeFEAbase).m_TotalMass +
                     (long)((peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-3] + 4));
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return uVar2;
}

Assistant:

unsigned int ChContactTriangleXYZ::GetSubBlockOffset(int nblock) {
    if (nblock == 0)
        return GetNode1()->NodeGetOffset_w();
    if (nblock == 1)
        return GetNode2()->NodeGetOffset_w();
    if (nblock == 2)
        return GetNode3()->NodeGetOffset_w();
    return 0;
}